

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void usage_exit(int exit_code)

{
  char **ppcVar1;
  char *local_50;
  FILE *local_40;
  char *machine;
  char **__end1;
  char **__begin1;
  availability *__range1;
  FILE *output;
  int exit_code_local;
  
  if (exit_code == 0) {
    local_40 = _stdout;
  }
  else {
    local_40 = _stderr;
  }
  if (program_name == (char *)0x0) {
    local_50 = "./basic";
  }
  else {
    local_50 = program_name;
  }
  fprintf(local_40,
          "Retro basic interpreter, for testing the chipemu library\n%s\nBuilt: Apr 26 2025 23:24:53\nUsage:\n%s [-h] [-t path] <machine type>\n  -h\n  --help          print this very helpful text, and exit\n  -s              print some statistics on exit\n  -t path\n  --trace path    print trace to file at `path`\n  <machine type>  basic interpreter to emulate, available choices are:\n"
          ,"https://github.com/GBuella/chipemu",local_50);
  __end1 = testbench::machine::availability::begin();
  ppcVar1 = testbench::machine::availability::end();
  for (; __end1 != ppcVar1; __end1 = __end1 + 1) {
    fprintf(local_40,"                     %s\n",*__end1);
  }
  exit(exit_code);
}

Assistant:

static void usage_exit(int exit_code)
{
    FILE *output = ((exit_code == EXIT_SUCCESS) ? stdout : stderr);

    fprintf(output, "Retro basic interpreter, for testing the chipemu library\n"
     "%s\n"
     "Built: " __DATE__ " " __TIME__ "\n"
     "Usage:\n"
     "%s [-h] [-t path] <machine type>\n"
     "  -h\n"
     "  --help          print this very helpful text, and exit\n"
     "  -s              print some statistics on exit\n"
     "  -t path\n"
     "  --trace path    print trace to file at `path`\n"
     "  <machine type>  basic interpreter to emulate, available choices are:\n",
     project_url,
     program_name ? program_name : "./basic");
    for (auto machine : testbench::machine::available) {
        fprintf(output, "                     %s\n", machine);
    }
    exit(exit_code);
}